

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_utils.c
# Opt level: O1

void dump_mmt_buf_as_words(mmt_buf *buf)

{
  uint uVar1;
  ulong uVar2;
  byte *pbVar3;
  
  uVar1 = buf->len;
  if (3 < uVar1) {
    uVar2 = 0;
    do {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%08x\n",(ulong)buf[uVar2 + 1].len);
      }
      else {
        fprintf(_stdout,"%64s        0x%08x\n"," ",(ulong)buf[uVar2 + 1].len);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      uVar2 = uVar2 + 1;
      uVar1 = buf->len;
    } while (uVar2 < uVar1 >> 2);
  }
  uVar1 = uVar1 & 0xfffffffc;
  if (uVar1 < buf->len) {
    pbVar3 = (byte *)((long)&buf[1].len + (long)(int)uVar1);
    do {
      if (indent_logs == 0) {
        fprintf(_stdout,"LOG:         0x%02x\n",(ulong)*pbVar3);
      }
      else {
        fprintf(_stdout,"%64s        0x%02x\n"," ",(ulong)*pbVar3);
      }
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      pbVar3 = pbVar3 + 1;
      uVar1 = uVar1 + 1;
    } while (uVar1 < buf->len);
  }
  return;
}

Assistant:

void dump_mmt_buf_as_words(struct mmt_buf *buf)
{
	int j;
	for (j = 0; j < buf->len / 4; ++j)
		mmt_log("        0x%08x\n", ((uint32_t *)buf->data)[j]);
	for (j = buf->len / 4 * 4; j < buf->len; ++j)
		mmt_log("        0x%02x\n", buf->data[j]);
}